

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O3

void __thiscall Channel::update(Channel *this)

{
  EventLoop *this_00;
  __shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  this_00 = this->loop_;
  std::__shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Channel,void>
            (local_28,(__weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *)this);
  EventLoop::updateChannel(this_00,(ChannelPtr *)local_28);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

void Channel::update() {
    loop_->updateChannel(shared_from_this());
}